

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t __thiscall
duckdb_zstd::ZSTD_initCStream_usingCDict_advanced
          (duckdb_zstd *this,ZSTD_CStream *zcs,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
          unsigned_long_long pledgedSrcSize)

{
  *(undefined4 *)(this + 0xe18) = 0;
  *(long *)(this + 0x2f8) =
       CONCAT44((int)((ulong)register0x00000080 >> 0x20),fParams.noDictIDFlag) + 1;
  *(ZSTD_CDict **)(this + 0x30) = cdict;
  *(int *)(this + 0x38) = fParams.contentSizeFlag;
  ZSTD_clearAllDicts((ZSTD_CCtx *)this);
  *(ZSTD_CStream **)(this + 0xe70) = zcs;
  return 0;
}

Assistant:

size_t ZSTD_initCStream_usingCDict_advanced(ZSTD_CStream* zcs,
                                            const ZSTD_CDict* cdict,
                                            ZSTD_frameParameters fParams,
                                            unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_usingCDict_advanced");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    zcs->requestedParams.fParams = fParams;
    FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, cdict) , "");
    return 0;
}